

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::AssignmentPatternExpressionSyntax::setChild
          (AssignmentPatternExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  AssignmentPatternSyntax *local_40;
  DataTypeSyntax *local_38;
  AssignmentPatternSyntax *local_20;
  not_null<slang::syntax::AssignmentPatternSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6afdea);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_38 = (DataTypeSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6afdfa);
      local_38 = SyntaxNode::as<slang::syntax::DataTypeSyntax>(pSVar1);
    }
    *(DataTypeSyntax **)(in_RDI + 0x18) = local_38;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6afe2c);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_40 = (AssignmentPatternSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6afe3c);
      local_40 = SyntaxNode::as<slang::syntax::AssignmentPatternSyntax>(pSVar1);
    }
    local_20 = local_40;
    not_null<slang::syntax::AssignmentPatternSyntax_*>::
    not_null<slang::syntax::AssignmentPatternSyntax_*>(local_18,&local_20);
    *(AssignmentPatternSyntax **)(in_RDI + 0x20) = local_18[0].ptr;
  }
  return;
}

Assistant:

void AssignmentPatternExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 1: pattern = child.node() ? &child.node()->as<AssignmentPatternSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}